

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O1

string * __thiscall
leveldb::RecoveryTest::Get
          (string *__return_storage_ptr__,RecoveryTest *this,string *k,Snapshot *snapshot)

{
  Status s;
  Status local_50;
  string local_48;
  pointer local_28;
  size_type local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)0x100;
  local_48._M_string_length = 0;
  local_28 = (k->_M_dataplus)._M_p;
  local_20 = k->_M_string_length;
  (*this->db_->_vptr_DB[5])(&local_50,this->db_,&local_48,&local_28,__return_storage_ptr__);
  if (local_50.state_ != (char *)0x0) {
    if (local_50.state_[4] == '\x01') {
      std::__cxx11::string::_M_replace
                ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                 0x1271f4);
    }
    else if (local_50.state_ != (char *)0x0) {
      Status::ToString_abi_cxx11_(&local_48,&local_50);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
  }
  if (local_50.state_ != (char *)0x0) {
    operator_delete__(local_50.state_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Get(const std::string& k, const Snapshot* snapshot = nullptr) {
    std::string result;
    Status s = db_->Get(ReadOptions(), k, &result);
    if (s.IsNotFound()) {
      result = "NOT_FOUND";
    } else if (!s.ok()) {
      result = s.ToString();
    }
    return result;
  }